

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# einsum.cpp
# Opt level: O1

float ncnn::sum_dim(vector<int,_std::allocator<int>_> *dim_sizes,int d,
                   vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *tokens,vector<int,_std::allocator<int>_> *indexes)

{
  pointer piVar1;
  char *pcVar2;
  pointer pMVar3;
  long lVar4;
  pointer pbVar5;
  long lVar6;
  float *pfVar7;
  int iVar8;
  float fVar9;
  float fVar10;
  
  if ((int)((ulong)((long)(dim_sizes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(dim_sizes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start) >> 2) == d) {
    pMVar3 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pMVar3;
    if (lVar4 == 0) {
      fVar10 = 1.0;
    }
    else {
      lVar4 = (lVar4 >> 3) * -0x71c71c71c71c71c7;
      pbVar5 = (tokens->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      piVar1 = (indexes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar4 = lVar4 + (ulong)(lVar4 == 0);
      fVar10 = 1.0;
      do {
        switch(pMVar3->dims) {
        case 1:
          pfVar7 = (float *)((long)piVar1[(long)*(pbVar5->_M_dataplus)._M_p + -0x69] * 4 +
                            (long)pMVar3->data);
          break;
        case 2:
          pcVar2 = (pbVar5->_M_dataplus)._M_p;
          pfVar7 = (float *)((long)pMVar3->data +
                            (long)piVar1[(long)pcVar2[1] + -0x69] * 4 +
                            (long)pMVar3->w * (long)piVar1[(long)*pcVar2 + -0x69] * pMVar3->elemsize
                            );
          break;
        case 3:
          pcVar2 = (pbVar5->_M_dataplus)._M_p;
          pfVar7 = (float *)((long)pMVar3->data +
                            (long)piVar1[(long)pcVar2[2] + -0x69] * 4 +
                            (long)pMVar3->w * pMVar3->elemsize *
                            (long)piVar1[(long)pcVar2[1] + -0x69] +
                            (long)piVar1[(long)*pcVar2 + -0x69] * pMVar3->cstep * pMVar3->elemsize);
          break;
        case 4:
          pcVar2 = (pbVar5->_M_dataplus)._M_p;
          lVar6 = (long)pMVar3->w * pMVar3->elemsize;
          pfVar7 = (float *)((long)pMVar3->data +
                            (long)piVar1[(long)pcVar2[3] + -0x69] * 4 +
                            lVar6 * piVar1[(long)pcVar2[2] + -0x69] +
                            pMVar3->h * lVar6 * (long)piVar1[(long)pcVar2[1] + -0x69] +
                            (long)piVar1[(long)*pcVar2 + -0x69] * pMVar3->cstep * pMVar3->elemsize);
          break;
        default:
          fVar9 = 0.0;
          goto LAB_005a7fae;
        }
        fVar9 = *pfVar7;
LAB_005a7fae:
        fVar10 = fVar10 * fVar9;
        pMVar3 = pMVar3 + 1;
        pbVar5 = pbVar5 + 1;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
    }
  }
  else if ((dim_sizes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start[d] < 1) {
    fVar10 = 0.0;
  }
  else {
    fVar10 = 0.0;
    iVar8 = 0;
    do {
      (indexes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start[d] = iVar8;
      fVar9 = sum_dim(dim_sizes,d + 1,bottom_blobs,tokens,indexes);
      fVar10 = fVar10 + fVar9;
      iVar8 = iVar8 + 1;
    } while (iVar8 < (dim_sizes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start[d]);
  }
  return fVar10;
}

Assistant:

static float sum_dim(const std::vector<int>& dim_sizes, int d, const std::vector<Mat>& bottom_blobs, const std::vector<std::string>& tokens, std::vector<int>& indexes)
{
    if (d == (int)dim_sizes.size())
    {
        float v = 1.f;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            v *= get_indexed_value(bottom_blobs[b], tokens[b], indexes);
        }

        return v;
    }

    float sum = 0.f;

    for (int i = 0; i < dim_sizes[d]; i++)
    {
        indexes[d] = i;

        sum += sum_dim(dim_sizes, d + 1, bottom_blobs, tokens, indexes);
    }

    return sum;
}